

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlat<int,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool,false,true>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  VectorType vector_type_p;
  bool bVar1;
  int *count_00;
  Vector *in_RCX;
  ValidityMask *in_RDX;
  undefined8 in_RDI;
  VectorType in_R8B;
  Vector *unaff_retaddr;
  idx_t in_stack_00000008;
  ValidityMask *result_validity;
  int *result_data;
  int *rdata;
  int *ldata;
  Vector *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 is_null;
  
  is_null = (undefined1)((ulong)in_RDI >> 0x38);
  vector_type_p = in_R8B & FSST_VECTOR;
  count_00 = FlatVector::GetData<int>((Vector *)0x12c9e4b);
  FlatVector::GetData<int>((Vector *)0x12c9e5a);
  bVar1 = ConstantVector::IsNull((Vector *)0x12c9e69);
  if (bVar1) {
    Vector::SetVectorType(in_RCX,vector_type_p);
    ConstantVector::SetNull(unaff_retaddr,(bool)is_null);
  }
  else {
    Vector::SetVectorType(in_RCX,vector_type_p);
    FlatVector::GetData<int>((Vector *)0x12c9ea8);
    FlatVector::Validity((Vector *)0x12c9eb7);
    bVar1 = BinaryStandardOperatorWrapper::AddsNulls();
    if (bVar1) {
      FlatVector::Validity((Vector *)0x12c9edb);
      TemplatedValidityMask<unsigned_long>::Copy
                ((TemplatedValidityMask<unsigned_long> *)in_RCX,
                 (TemplatedValidityMask<unsigned_long> *)
                 CONCAT17(vector_type_p,in_stack_ffffffffffffffd8),(idx_t)count_00);
    }
    else {
      FlatVector::Validity((Vector *)0x12c9f02);
      FlatVector::SetValidity(in_stack_ffffffffffffffb0,in_RDX);
    }
    ExecuteFlatLoop<int,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool,false,true>
              (rdata,result_data,(int *)result_validity,in_stack_00000008,
               (ValidityMask *)unaff_retaddr,(bool)is_null);
  }
  return;
}

Assistant:

static void ExecuteFlat(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if ((LEFT_CONSTANT && ConstantVector::IsNull(left)) || (RIGHT_CONSTANT && ConstantVector::IsNull(right))) {
			// either left or right is constant NULL: result is constant NULL
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		auto &result_validity = FlatVector::Validity(result);
		if (LEFT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(right), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(right));
			}
		} else if (RIGHT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
			}
		} else {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
				if (result_validity.AllValid()) {
					result_validity.Copy(FlatVector::Validity(right), count);
				} else {
					result_validity.Combine(FlatVector::Validity(right), count);
				}
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
				result_validity.Combine(FlatVector::Validity(right), count);
			}
		}
		ExecuteFlatLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, result_data, count, result_validity, fun);
	}